

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O1

Light_SampleRes * __thiscall
embree::Lights_sample
          (Light_SampleRes *__return_storage_ptr__,embree *this,Light *self,DifferentialGeometry *dg
          ,Vec2f *s)

{
  switch(*(undefined4 *)this) {
  case 0:
    AmbientLight_sample(__return_storage_ptr__,this,self,dg,s);
    break;
  case 1:
    PointLight_sample(__return_storage_ptr__,(Light *)this,(DifferentialGeometry *)self,(Vec2f *)dg)
    ;
    break;
  case 2:
    DirectionalLight_sample
              (__return_storage_ptr__,(Light *)this,(DifferentialGeometry *)self,(Vec2f *)dg);
    break;
  case 3:
    SpotLight_sample(__return_storage_ptr__,(Light *)this,(DifferentialGeometry *)self,(Vec2f *)dg);
    break;
  default:
    *(undefined8 *)&(__return_storage_ptr__->dir).field_0 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->dir).field_0 + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->weight).field_0 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->weight).field_0 + 8) = 0;
    __return_storage_ptr__->dist = 0.0;
    __return_storage_ptr__->pdf = INFINITY;
    break;
  case 6:
    QuadLight_sample(__return_storage_ptr__,(Light *)this,(DifferentialGeometry *)self,(Vec2f *)dg);
  }
  return __return_storage_ptr__;
}

Assistant:

Light_SampleRes Lights_sample(const Light* self,
                              const DifferentialGeometry& dg, /*! point to generate the sample for >*/
                              const Vec2f s)                /*! random numbers to generate the sample >*/
{
  TutorialLightType ty = self->type;
  switch (ty) {
  case LIGHT_AMBIENT    : return AmbientLight_sample(self,dg,s);
  case LIGHT_POINT      : return PointLight_sample(self,dg,s);
  case LIGHT_DIRECTIONAL: return DirectionalLight_sample(self,dg,s);
  case LIGHT_SPOT       : return SpotLight_sample(self,dg,s);
  case LIGHT_QUAD       : return QuadLight_sample(self,dg,s);
  default: {
    Light_SampleRes res;
    res.weight = Vec3fa(0,0,0);
    res.dir = Vec3fa(0,0,0);
    res.dist = 0;
    res.pdf = inf;
    return res;
  }
  }
}